

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O2

void __thiscall Args::HelpPrinter::print(HelpPrinter *this,ArgIface *arg,OutStreamType *to)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  StringList usage;
  StringList local_30;
  
  iVar1 = (*arg->_vptr_ArgIface[5])(arg);
  createUsageString_abi_cxx11_(&usage,this,arg,SUB41(iVar1,0));
  std::operator<<(to,"USAGE: ");
  std::
  for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Args::HelpPrinter::print(Args::ArgIface*,std::ostream&)const::_lambda(std::__cxx11::string_const&)_1_>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )usage.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )usage.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_3fcf6739)to);
  poVar2 = std::operator<<(to,"\n");
  std::operator<<(poVar2,"\n");
  iVar1 = (*arg->_vptr_ArgIface[0xb])(arg);
  splitToWords(&local_30,this,(String *)CONCAT44(extraout_var,iVar1));
  printString(this,to,&local_30,0,7,7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  poVar2 = std::operator<<(to,"\n");
  std::operator<<(poVar2,"\n");
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&usage);
  return;
}

Assistant:

inline void
HelpPrinter::print( ArgIface * arg, OutStreamType & to ) const
{
	StringList usage = createUsageString( arg,
		arg->isRequired() );

	to << "USAGE: ";

	std::for_each( usage.cbegin(), usage.cend(),
		[ & ] ( const String & s )
			{ to << s << ' '; }
	);

	to << "\n" << "\n";

	printString( to, splitToWords( arg->longDescription() ),
		0, 7, 7 );

	to << "\n" << "\n";

	to.flush();
}